

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,ImDrawFlags flags,
          float thickness)

{
  ImVec2 *pIVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  ImVec2 *pIVar4;
  ImVec4 *pIVar5;
  ImDrawVert *pIVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  ImVec2 IVar10;
  ImVec2 IVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint vtx_count;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ImDrawIdx IVar21;
  byte bVar22;
  long lVar23;
  long lVar24;
  ImDrawIdx IVar25;
  ImDrawIdx IVar26;
  long lVar27;
  ImDrawIdx IVar28;
  ImDrawIdx IVar29;
  uint uVar30;
  ulong uVar31;
  ImVec2 IVar32;
  float fVar33;
  float fVar38;
  float fVar39;
  ImVec2 IVar34;
  ImVec2 IVar35;
  ImVec2 IVar36;
  ImVec2 IVar37;
  float fVar40;
  float fVar41;
  float fVar42;
  ImVec2 IVar43;
  ImVec2 IVar44;
  long lStack_a0;
  
  if (points_count < 2) {
    return;
  }
  uVar30 = points_count - 1;
  IVar3 = this->_Data->TexUvWhitePixel;
  uVar17 = points_count;
  if ((flags & 1U) == 0) {
    uVar17 = uVar30;
  }
  uVar31 = (ulong)(uint)points_count;
  if ((this->Flags & 1U) == 0) {
    PrimReserve(this,uVar17 * 6,uVar17 << 2);
    for (uVar15 = 1; uVar15 - uVar17 != 1; uVar15 = uVar15 + 1) {
      uVar18 = uVar15 & 0xffffffff;
      if (uVar31 == uVar15) {
        uVar18 = 0;
      }
      fVar39 = points[uVar15 - 1].x;
      fVar33 = points[uVar18].x - fVar39;
      fVar38 = points[uVar18].y - points[uVar15 - 1].y;
      fVar40 = fVar33 * fVar33 + fVar38 * fVar38;
      if (0.0 < fVar40) {
        fVar40 = 1.0 / SQRT(fVar40);
        fVar33 = fVar33 * fVar40;
        fVar38 = fVar38 * fVar40;
      }
      fVar33 = thickness * 0.5 * fVar33;
      fVar38 = fVar38 * thickness * 0.5;
      (this->_VtxWritePtr->pos).x = fVar39 + fVar38;
      (this->_VtxWritePtr->pos).y = points[uVar15 - 1].y - fVar33;
      this->_VtxWritePtr->uv = IVar3;
      this->_VtxWritePtr->col = col;
      this->_VtxWritePtr[1].pos.x = points[uVar18].x + fVar38;
      this->_VtxWritePtr[1].pos.y = points[uVar18].y - fVar33;
      this->_VtxWritePtr[1].uv = IVar3;
      this->_VtxWritePtr[1].col = col;
      this->_VtxWritePtr[2].pos.x = points[uVar18].x - fVar38;
      this->_VtxWritePtr[2].pos.y = points[uVar18].y + fVar33;
      this->_VtxWritePtr[2].uv = IVar3;
      this->_VtxWritePtr[2].col = col;
      this->_VtxWritePtr[3].pos.x = points[uVar15 - 1].x - fVar38;
      this->_VtxWritePtr[3].pos.y = fVar33 + points[uVar15 - 1].y;
      this->_VtxWritePtr[3].uv = IVar3;
      this->_VtxWritePtr[3].col = col;
      this->_VtxWritePtr = this->_VtxWritePtr + 4;
      *this->_IdxWritePtr = (ImDrawIdx)this->_VtxCurrentIdx;
      this->_IdxWritePtr[1] = (short)this->_VtxCurrentIdx + 1;
      this->_IdxWritePtr[2] = (short)this->_VtxCurrentIdx + 2;
      this->_IdxWritePtr[3] = (ImDrawIdx)this->_VtxCurrentIdx;
      this->_IdxWritePtr[4] = (short)this->_VtxCurrentIdx + 2;
      this->_IdxWritePtr[5] = (short)this->_VtxCurrentIdx + 3;
      this->_IdxWritePtr = this->_IdxWritePtr + 6;
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
    }
    return;
  }
  fVar33 = thickness;
  if (thickness <= 1.0) {
    fVar33 = 1.0;
  }
  iVar16 = (int)fVar33;
  fVar38 = this->_FringeScale;
  bVar22 = fVar38 == 1.0 & iVar16 < 0x3f & (byte)this->Flags >> 1 & fVar33 - (float)iVar16 <= 1e-05;
  iVar13 = 0x12;
  if (thickness <= fVar38) {
    iVar13 = 0xc;
  }
  iVar12 = 6;
  if (bVar22 == 0) {
    iVar12 = iVar13;
  }
  if (bVar22 == 1) {
    vtx_count = points_count * 2;
    iVar13 = 3;
  }
  else {
    vtx_count = points_count * 3;
    if (fVar38 < thickness) {
      vtx_count = points_count * 4;
    }
    iVar13 = (uint)(fVar38 < thickness) * 2 + 3;
  }
  uVar14 = col & 0xffffff;
  PrimReserve(this,iVar12 * uVar17,vtx_count);
  ImVector<ImVec2>::reserve_discard(&this->_Data->TempBuffer,iVar13 * points_count);
  pIVar4 = (this->_Data->TempBuffer).Data;
  lVar24 = -(ulong)uVar17;
  for (uVar15 = 1; lVar24 + uVar15 != 1; uVar15 = uVar15 + 1) {
    uVar18 = uVar15 & 0xffffffff;
    if (uVar31 == uVar15) {
      uVar18 = 0;
    }
    fVar40 = points[uVar18].x - points[uVar15 - 1].x;
    fVar39 = points[uVar18].y - points[uVar15 - 1].y;
    fVar41 = fVar40 * fVar40 + fVar39 * fVar39;
    if (0.0 < fVar41) {
      fVar41 = 1.0 / SQRT(fVar41);
      fVar40 = fVar40 * fVar41;
      fVar39 = fVar39 * fVar41;
    }
    pIVar4[uVar15 - 1].x = fVar39;
    pIVar4[uVar15 - 1].y = -fVar40;
  }
  pIVar1 = pIVar4 + uVar31;
  if ((flags & 1U) == 0) {
    pIVar4[uVar30] = pIVar1[-2];
    if (fVar38 < thickness && bVar22 == 0) {
      fVar33 = (fVar33 - fVar38) * 0.5;
      fVar38 = fVar38 + fVar33;
      fVar40 = (*pIVar4).x;
      fVar41 = fVar38 * fVar40;
      fVar39 = (*pIVar4).y;
      fVar42 = fVar38 * fVar39;
      IVar8.y = (*points).y + fVar42;
      IVar8.x = (*points).x + fVar41;
      *pIVar1 = IVar8;
      fVar40 = fVar40 * fVar33;
      fVar39 = fVar39 * fVar33;
      IVar43.x = (*points).x + fVar40;
      IVar43.y = (*points).y + fVar39;
      pIVar1[1] = IVar43;
      IVar44.x = (*points).x - fVar40;
      IVar44.y = (*points).y - fVar39;
      pIVar1[2] = IVar44;
      IVar37.x = (*points).x - fVar41;
      IVar37.y = (*points).y - fVar42;
      pIVar1[3] = IVar37;
      uVar15 = (ulong)(uVar30 * 4);
      IVar10.y = points[uVar30].y + pIVar4[uVar30].y * fVar38;
      IVar10.x = points[uVar30].x + pIVar4[uVar30].x * fVar38;
      pIVar1[uVar15] = IVar10;
      IVar11.y = points[uVar30].y + pIVar4[uVar30].y * fVar33;
      IVar11.x = points[uVar30].x + pIVar4[uVar30].x * fVar33;
      pIVar1[uVar15 + 1] = IVar11;
      IVar9.y = points[uVar30].y - pIVar4[uVar30].y * fVar33;
      IVar9.x = points[uVar30].x - pIVar4[uVar30].x * fVar33;
      pIVar1[uVar15 + 2] = IVar9;
      IVar32.x = points[uVar30].x - pIVar4[uVar30].x * fVar38;
      IVar32.y = points[uVar30].y - pIVar4[uVar30].y * fVar38;
      pIVar1[uVar15 + 3] = IVar32;
LAB_001de59f:
      uVar30 = this->_VtxCurrentIdx;
      for (uVar15 = 1; lVar24 + uVar15 != 1; uVar15 = uVar15 + 1) {
        uVar18 = uVar15 & 0xffffffff;
        if (uVar31 == uVar15) {
          uVar18 = 0;
        }
        uVar17 = uVar30 + 4;
        if (uVar31 == uVar15) {
          uVar17 = this->_VtxCurrentIdx;
        }
        fVar40 = (pIVar4[uVar18].x + pIVar4[uVar15 - 1].x) * 0.5;
        fVar39 = (pIVar4[uVar18].y + pIVar4[uVar15 - 1].y) * 0.5;
        fVar41 = fVar40 * fVar40 + fVar39 * fVar39;
        if (1e-06 < fVar41) {
          fVar41 = 1.0 / fVar41;
          fVar42 = 100.0;
          if (fVar41 <= 100.0) {
            fVar42 = fVar41;
          }
          fVar40 = fVar40 * fVar42;
          fVar39 = fVar39 * fVar42;
        }
        uVar19 = (ulong)(uint)((int)uVar18 * 4);
        pIVar1[uVar19].x = points[uVar18].x + fVar38 * fVar40;
        pIVar1[uVar19].y = points[uVar18].y + fVar38 * fVar39;
        pIVar1[uVar19 + 1].x = points[uVar18].x + fVar33 * fVar40;
        pIVar1[uVar19 + 1].y = points[uVar18].y + fVar39 * fVar33;
        pIVar1[uVar19 + 2].x = points[uVar18].x - fVar33 * fVar40;
        pIVar1[uVar19 + 2].y = points[uVar18].y - fVar39 * fVar33;
        pIVar1[uVar19 + 3].x = points[uVar18].x - fVar38 * fVar40;
        pIVar1[uVar19 + 3].y = points[uVar18].y - fVar38 * fVar39;
        IVar29 = (ImDrawIdx)uVar17;
        IVar28 = IVar29 + 1;
        *this->_IdxWritePtr = IVar28;
        IVar25 = (ImDrawIdx)uVar30;
        this->_IdxWritePtr[1] = IVar25 + 1;
        IVar21 = IVar25 + 2;
        this->_IdxWritePtr[2] = IVar21;
        this->_IdxWritePtr[3] = IVar21;
        IVar26 = IVar29 + 2;
        this->_IdxWritePtr[4] = IVar26;
        this->_IdxWritePtr[5] = IVar28;
        this->_IdxWritePtr[6] = IVar28;
        this->_IdxWritePtr[7] = IVar25 + 1;
        this->_IdxWritePtr[8] = IVar25;
        this->_IdxWritePtr[9] = IVar25;
        this->_IdxWritePtr[10] = IVar29;
        this->_IdxWritePtr[0xb] = IVar28;
        this->_IdxWritePtr[0xc] = IVar26;
        this->_IdxWritePtr[0xd] = IVar21;
        this->_IdxWritePtr[0xe] = IVar25 + 3;
        this->_IdxWritePtr[0xf] = IVar25 + 3;
        this->_IdxWritePtr[0x10] = IVar29 + 3;
        this->_IdxWritePtr[0x11] = IVar26;
        this->_IdxWritePtr = this->_IdxWritePtr + 0x12;
        uVar30 = uVar17;
      }
      for (lVar24 = 0; uVar31 * 0x20 != lVar24; lVar24 = lVar24 + 0x20) {
        this->_VtxWritePtr->pos = *(ImVec2 *)((long)&pIVar4[uVar31].x + lVar24);
        this->_VtxWritePtr->uv = IVar3;
        this->_VtxWritePtr->col = uVar14;
        this->_VtxWritePtr[1].pos = *(ImVec2 *)((long)&pIVar4[uVar31 + 1].x + lVar24);
        this->_VtxWritePtr[1].uv = IVar3;
        this->_VtxWritePtr[1].col = col;
        this->_VtxWritePtr[2].pos = *(ImVec2 *)((long)&pIVar4[uVar31 + 2].x + lVar24);
        this->_VtxWritePtr[2].uv = IVar3;
        this->_VtxWritePtr[2].col = col;
        this->_VtxWritePtr[3].pos = *(ImVec2 *)((long)&pIVar4[uVar31 + 3].x + lVar24);
        this->_VtxWritePtr[3].uv = IVar3;
        this->_VtxWritePtr[3].col = uVar14;
        this->_VtxWritePtr = this->_VtxWritePtr + 4;
      }
      goto LAB_001de8be;
    }
    if (bVar22 != 0) {
      fVar38 = fVar33 * 0.5 + 1.0;
    }
    fVar33 = (*pIVar4).x * fVar38;
    fVar40 = (*pIVar4).y * fVar38;
    IVar34.x = (*points).x + fVar33;
    IVar34.y = (*points).y + fVar40;
    *pIVar1 = IVar34;
    IVar35.x = (*points).x - fVar33;
    IVar35.y = (*points).y - fVar40;
    pIVar1[1] = IVar35;
    IVar36.x = points[uVar30].x + pIVar4[uVar30].x * fVar38;
    IVar36.y = points[uVar30].y + pIVar4[uVar30].y * fVar38;
    pIVar1[uVar30 * 2] = IVar36;
    IVar7.y = points[uVar30].y - pIVar4[uVar30].y * fVar38;
    IVar7.x = points[uVar30].x - pIVar4[uVar30].x * fVar38;
    pIVar1[(ulong)(uVar30 * 2) + 1] = IVar7;
  }
  else {
    if ((thickness <= fVar38 | bVar22) != 1) {
      fVar33 = (fVar33 - fVar38) * 0.5;
      fVar38 = fVar38 + fVar33;
      goto LAB_001de59f;
    }
    if (bVar22 != 0) {
      fVar38 = fVar33 * 0.5 + 1.0;
    }
  }
  uVar30 = this->_VtxCurrentIdx;
  for (uVar15 = 1; IVar29 = (ImDrawIdx)uVar30, lVar24 + uVar15 != 1; uVar15 = uVar15 + 1) {
    uVar18 = uVar15 & 0xffffffff;
    if (uVar31 == uVar15) {
      uVar18 = 0;
    }
    uVar30 = uVar30 + (bVar22 ^ 3);
    if (uVar31 == uVar15) {
      uVar30 = this->_VtxCurrentIdx;
    }
    IVar25 = (ImDrawIdx)uVar30;
    fVar33 = (pIVar4[uVar18].x + pIVar4[uVar15 - 1].x) * 0.5;
    fVar40 = (pIVar4[uVar18].y + pIVar4[uVar15 - 1].y) * 0.5;
    fVar39 = fVar33 * fVar33 + fVar40 * fVar40;
    if (1e-06 < fVar39) {
      fVar39 = 1.0 / fVar39;
      fVar41 = 100.0;
      if (fVar39 <= 100.0) {
        fVar41 = fVar39;
      }
      fVar33 = fVar33 * fVar41;
      fVar40 = fVar40 * fVar41;
    }
    uVar19 = (ulong)(uint)((int)uVar18 * 2);
    pIVar1[uVar19].x = points[uVar18].x + fVar38 * fVar33;
    pIVar1[uVar19].y = points[uVar18].y + fVar40 * fVar38;
    pIVar1[uVar19 + 1].x = points[uVar18].x - fVar38 * fVar33;
    pIVar1[uVar19 + 1].y = points[uVar18].y - fVar40 * fVar38;
    *this->_IdxWritePtr = IVar25;
    this->_IdxWritePtr[1] = IVar29;
    if (bVar22 == 0) {
      this->_IdxWritePtr[2] = IVar29 + 2;
      this->_IdxWritePtr[3] = IVar29 + 2;
      this->_IdxWritePtr[4] = IVar25 + 2;
      this->_IdxWritePtr[5] = IVar25;
      IVar21 = IVar25 + 1;
      this->_IdxWritePtr[6] = IVar21;
      this->_IdxWritePtr[7] = IVar29 + 1;
      this->_IdxWritePtr[8] = IVar29;
      lVar27 = 0x12;
      lVar23 = 0x14;
      lVar20 = 0x16;
      lStack_a0 = 0x18;
    }
    else {
      IVar28 = IVar29 + 1;
      this->_IdxWritePtr[2] = IVar28;
      IVar29 = IVar25 + 1;
      lVar27 = 6;
      lVar23 = 8;
      lVar20 = 10;
      lStack_a0 = 0xc;
      IVar21 = IVar25;
      IVar25 = IVar28;
    }
    *(ImDrawIdx *)((long)this->_IdxWritePtr + lVar27) = IVar29;
    *(ImDrawIdx *)((long)this->_IdxWritePtr + lVar23) = IVar25;
    *(ImDrawIdx *)((long)this->_IdxWritePtr + lVar20) = IVar21;
    this->_IdxWritePtr = (ImDrawIdx *)((long)this->_IdxWritePtr + lStack_a0);
  }
  if (bVar22 == 0) {
    for (lVar24 = 0; uVar31 * 8 - lVar24 != 0; lVar24 = lVar24 + 8) {
      this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar24);
      this->_VtxWritePtr->uv = IVar3;
      this->_VtxWritePtr->col = col;
      this->_VtxWritePtr[1].pos = *(ImVec2 *)((long)&pIVar4[uVar31].x + lVar24 * 2);
      this->_VtxWritePtr[1].uv = IVar3;
      this->_VtxWritePtr[1].col = uVar14;
      this->_VtxWritePtr[2].pos = *(ImVec2 *)((long)&pIVar4[uVar31 + 1].x + lVar24 * 2);
      this->_VtxWritePtr[2].uv = IVar3;
      this->_VtxWritePtr[2].col = uVar14;
      this->_VtxWritePtr = this->_VtxWritePtr + 3;
    }
  }
  else {
    pIVar5 = this->_Data->TexUvLines;
    pIVar2 = pIVar5 + iVar16;
    fVar33 = pIVar2->x;
    fVar38 = pIVar2->y;
    pIVar5 = pIVar5 + iVar16;
    fVar40 = pIVar5->z;
    fVar39 = pIVar5->w;
    for (lVar24 = 0; uVar31 * 0x10 != lVar24; lVar24 = lVar24 + 0x10) {
      this->_VtxWritePtr->pos = *(ImVec2 *)((long)&pIVar4[uVar31].x + lVar24);
      pIVar6 = this->_VtxWritePtr;
      (pIVar6->uv).x = fVar33;
      (pIVar6->uv).y = fVar38;
      this->_VtxWritePtr->col = col;
      this->_VtxWritePtr[1].pos = *(ImVec2 *)((long)&pIVar4[uVar31 + 1].x + lVar24);
      pIVar6 = this->_VtxWritePtr;
      pIVar6[1].uv.x = fVar40;
      pIVar6[1].uv.y = fVar39;
      this->_VtxWritePtr[1].col = col;
      this->_VtxWritePtr = this->_VtxWritePtr + 2;
    }
  }
LAB_001de8be:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + (vtx_count & 0xffff);
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, ImDrawFlags flags, float thickness)
{
    if (points_count < 2)
        return;

    const bool closed = (flags & ImDrawFlags_Closed) != 0;
    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        _Data->TempBuffer.reserve_discard(points_count * ((use_texture || !thick_line) ? 3 : 5));
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}